

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O1

ssize_t cornelich::util::stop_bit::read(int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  ulong uVar2;
  logic_error *this;
  uint uVar3;
  long lVar4;
  undefined4 in_register_0000003c;
  long lVar5;
  char *pcVar6;
  int iVar7;
  
  lVar5 = CONCAT44(in_register_0000003c,__fd);
  iVar7 = *__buf;
  *(int *)__buf = iVar7 + 1;
  cVar1 = *(char *)(lVar5 + iVar7);
  uVar2 = (ulong)cVar1;
  if ((long)uVar2 < 0) {
    uVar2 = (ulong)((int)cVar1 & 0x7f);
    iVar7 = *__buf;
    *(int *)__buf = iVar7 + 1;
    lVar4 = (long)*(char *)(lVar5 + iVar7);
    if (lVar4 < 0) {
      pcVar6 = (char *)(lVar5 + (iVar7 + 1));
      iVar7 = iVar7 + 2;
      uVar3 = 7;
      do {
        uVar2 = uVar2 | (ulong)((uint)lVar4 & 0x7f) << ((byte)uVar3 & 0x3f);
        uVar3 = uVar3 + 7;
        *(int *)__buf = iVar7;
        lVar4 = (long)*pcVar6;
        pcVar6 = pcVar6 + 1;
        iVar7 = iVar7 + 1;
      } while (lVar4 < 0);
    }
    else {
      uVar3 = 7;
    }
    if ((char)lVar4 == '\0') {
      if (0x3f < uVar3) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Cannot read more than 10 stop bits of negative value");
        goto LAB_00116f9d;
      }
      uVar2 = ~uVar2;
    }
    else {
      if (0x38 < uVar3) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Cannot read more than 9 stop bits of positive value");
LAB_00116f9d:
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar2 = uVar2 | lVar4 << ((byte)uVar3 & 0x3f);
    }
  }
  return uVar2;
}

Assistant:

std::int64_t read(const std::uint8_t * buffer, std::int32_t & offset)
{
    std::int64_t l;
    if ((l = (std::int8_t)buffer[offset++]) >= 0)
        return l;
    l &= 0x7FL;
    std::int64_t b;
    int count = 7;
    while ((b = (std::int8_t)buffer[offset++]) < 0)
    {
        l |= (b & 0x7FL) << count;
        count += 7;
    }
    if (b != 0)
    {
        if (count > 56)
            throw std::logic_error("Cannot read more than 9 stop bits of positive value");
        return l | (b << count);
    }
    else
    {
        if (count > 63)
            throw std::logic_error("Cannot read more than 10 stop bits of negative value");
        return ~l;
    }
}